

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::GenerateGraphViz(cmake *this,char *fileName)

{
  cmGraphVizWriter *pcVar1;
  cmGlobalGenerator *this_00;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators;
  char *pcVar2;
  char *fallbackSettingsFileName;
  allocator local_79;
  string local_78 [8];
  string fallbackSettingsFile;
  string local_50 [8];
  string settingsFile;
  auto_ptr<cmGraphVizWriter> local_20;
  auto_ptr<cmGraphVizWriter> gvWriter;
  char *fileName_local;
  cmake *this_local;
  
  gvWriter.x_ = (cmGraphVizWriter *)fileName;
  pcVar1 = (cmGraphVizWriter *)operator_new(0x108);
  this_00 = GetGlobalGenerator(this);
  localGenerators = cmGlobalGenerator::GetLocalGenerators(this_00);
  cmGraphVizWriter::cmGraphVizWriter(pcVar1,localGenerators);
  ::cm::auto_ptr<cmGraphVizWriter>::auto_ptr(&local_20,pcVar1);
  pcVar2 = GetHomeOutputDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,pcVar2,(allocator *)(fallbackSettingsFile.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(fallbackSettingsFile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_50,"/CMakeGraphVizOptions.cmake");
  pcVar2 = GetHomeDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar2,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::operator+=(local_78,"/CMakeGraphVizOptions.cmake");
  pcVar1 = ::cm::auto_ptr<cmGraphVizWriter>::operator->(&local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  fallbackSettingsFileName = (char *)std::__cxx11::string::c_str();
  cmGraphVizWriter::ReadSettings(pcVar1,pcVar2,fallbackSettingsFileName);
  pcVar1 = ::cm::auto_ptr<cmGraphVizWriter>::operator->(&local_20);
  cmGraphVizWriter::WritePerTargetFiles(pcVar1,(char *)gvWriter.x_);
  pcVar1 = ::cm::auto_ptr<cmGraphVizWriter>::operator->(&local_20);
  cmGraphVizWriter::WriteTargetDependersFiles(pcVar1,(char *)gvWriter.x_);
  pcVar1 = ::cm::auto_ptr<cmGraphVizWriter>::operator->(&local_20);
  cmGraphVizWriter::WriteGlobalFile(pcVar1,(char *)gvWriter.x_);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_50);
  ::cm::auto_ptr<cmGraphVizWriter>::~auto_ptr(&local_20);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const char* fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  CM_AUTO_PTR<cmGraphVizWriter> gvWriter(
    new cmGraphVizWriter(this->GetGlobalGenerator()->GetLocalGenerators()));

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter->ReadSettings(settingsFile.c_str(), fallbackSettingsFile.c_str());

  gvWriter->WritePerTargetFiles(fileName);
  gvWriter->WriteTargetDependersFiles(fileName);
  gvWriter->WriteGlobalFile(fileName);

#endif
}